

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

bool __thiscall
Graph::containsPathToNode
          (Graph *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *visitedNodes,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *loops)

{
  pointer pcVar1;
  pointer pbVar2;
  pointer pbVar3;
  size_t __n;
  bool bVar4;
  byte bVar5;
  int iVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  pointer pCVar8;
  Connection connection;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  copyVisited;
  undefined4 local_e4;
  long *local_d0;
  size_t local_c8;
  long local_c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90 [2];
  long local_80 [2];
  Graph *local_70;
  pointer local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_48 [24];
  
  pCVar8 = (this->connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_68 = (this->connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (pCVar8 != local_68) {
    local_e4 = SUB84(local_68,0);
    local_70 = this;
    do {
      local_d0 = local_c0;
      pcVar1 = (pCVar8->name_from)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar1,pcVar1 + (pCVar8->name_from)._M_string_length);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar1 = (pCVar8->name_to)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar1,pcVar1 + (pCVar8->name_to)._M_string_length);
      local_90[0] = local_80;
      pcVar1 = (pCVar8->label)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,pcVar1,pcVar1 + (pCVar8->label)._M_string_length);
      pbVar2 = (visitedNodes->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      bVar4 = true;
      if (local_c8 == pbVar2[-1]._M_string_length) {
        pbVar3 = (visitedNodes->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((local_c8 == 0) ||
           (iVar6 = bcmp(local_d0,pbVar2[-1]._M_dataplus._M_p,local_c8), iVar6 == 0)) {
          __n = pbVar3->_M_string_length;
          if ((__n == local_b0._M_string_length) &&
             ((__n == 0 ||
              (iVar6 = bcmp((pbVar3->_M_dataplus)._M_p,local_b0._M_dataplus._M_p,__n), iVar6 == 0)))
             ) {
            std::
            vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::push_back(loops,visitedNodes);
            local_e4 = 1;
            bVar4 = false;
          }
          else {
            _Var7 = std::
                    __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              (pbVar3,pbVar2,&local_b0);
            if (_Var7._M_current ==
                (visitedNodes->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_48,visitedNodes);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string_const&>(local_48,&local_b0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_60,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_48);
              containsPathToNode(local_70,&local_60,loops);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_60);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_48);
              goto LAB_0011527d;
            }
            bVar4 = false;
            local_e4 = 0;
          }
        }
        else {
LAB_0011527d:
          bVar4 = true;
        }
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0,local_c0[0] + 1);
      }
      if (!bVar4) {
        bVar5 = (byte)local_e4;
        goto LAB_001152f3;
      }
      pCVar8 = pCVar8 + 1;
    } while (pCVar8 != local_68);
  }
  bVar5 = 0;
LAB_001152f3:
  return (bool)(bVar5 & 1);
}

Assistant:

bool Graph::containsPathToNode(std::vector<std::string> visitedNodes,
                               std::vector<std::vector<std::string>> &loops) {
    for (auto connection: connections) {
        if (connection.getName_from() == visitedNodes[visitedNodes.size() - 1]) {
            if (visitedNodes[0] == connection.getName_to()) {
                // Found yah
                loops.push_back(visitedNodes);
                return true;
            } else if (std::find(visitedNodes.begin(), visitedNodes.end(), connection.getName_to()) !=
                       visitedNodes.end()) {
                return false; // Just another cycle, not the one we're searching for
            } else {
                std::vector<std::string> copyVisited = visitedNodes;
                copyVisited.emplace_back(connection.getName_to());
                containsPathToNode(copyVisited, loops);
            }
        }
    }
    return false;
}